

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.h
# Opt level: O0

bool google::protobuf::compiler::csharp::IsDescriptorOptionMessage(Descriptor *descriptor)

{
  bool bVar1;
  FileDescriptor *descriptor_00;
  string *psVar2;
  bool local_51;
  undefined1 local_38 [8];
  string name;
  Descriptor *descriptor_local;
  
  name.field_2._8_8_ = descriptor;
  descriptor_00 = Descriptor::file(descriptor);
  bVar1 = IsDescriptorProto(descriptor_00);
  if (bVar1) {
    psVar2 = Descriptor::full_name_abi_cxx11_((Descriptor *)name.field_2._8_8_);
    std::__cxx11::string::string((string *)local_38,(string *)psVar2);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"google.protobuf.FileOptions");
    local_51 = true;
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"google.protobuf.MessageOptions");
      local_51 = true;
      if (!bVar1) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"google.protobuf.FieldOptions");
        local_51 = true;
        if (!bVar1) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_38,"google.protobuf.OneofOptions");
          local_51 = true;
          if (!bVar1) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_38,"google.protobuf.EnumOptions");
            local_51 = true;
            if (!bVar1) {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_38,"google.protobuf.EnumValueOptions");
              local_51 = true;
              if (!bVar1) {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_38,"google.protobuf.ServiceOptions");
                local_51 = true;
                if (!bVar1) {
                  local_51 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_38,"google.protobuf.MethodOptions");
                }
              }
            }
          }
        }
      }
    }
    descriptor_local._7_1_ = local_51;
    std::__cxx11::string::~string((string *)local_38);
  }
  else {
    descriptor_local._7_1_ = false;
  }
  return descriptor_local._7_1_;
}

Assistant:

inline bool IsDescriptorOptionMessage(const Descriptor* descriptor) {
  if (!IsDescriptorProto(descriptor->file())) {
    return false;
  }
  const string name = descriptor->full_name();
  return name == "google.protobuf.FileOptions" ||
      name == "google.protobuf.MessageOptions" ||
      name == "google.protobuf.FieldOptions" ||
      name == "google.protobuf.OneofOptions" ||
      name == "google.protobuf.EnumOptions" ||
      name == "google.protobuf.EnumValueOptions" ||
      name == "google.protobuf.ServiceOptions" ||
      name == "google.protobuf.MethodOptions";
}